

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_attn_kv_unified::set_input
          (llm_graph_input_attn_kv_unified *this,llama_ubatch *ubatch)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ggml_tensor *pgVar9;
  char *pcVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  int i;
  ulong uVar17;
  float fVar18;
  float fVar19;
  llama_seq_id seq_id;
  llama_seq_id local_8c;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  llama_ubatch *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  pgVar9 = this->self_kq_mask_swa;
  if (this->self_kq_mask != (ggml_tensor *)0x0 || pgVar9 != (ggml_tensor *)0x0) {
    uVar11 = (ulong)this->kv_self->n;
    uVar2 = ubatch->n_tokens;
    uVar15 = (ulong)ubatch->n_seq_tokens;
    local_58 = (ulong)ubatch->n_seqs;
    if (this->self_kq_mask == (ggml_tensor *)0x0) {
      pvVar12 = (void *)0x0;
    }
    else {
      cVar5 = ggml_backend_buffer_is_host();
      if (cVar5 == '\0') {
        pcVar10 = "ggml_backend_buffer_is_host(self_kq_mask->buffer)";
        uVar16 = 0x1ae;
        goto LAB_001eb7f8;
      }
      pgVar9 = this->self_kq_mask_swa;
      pvVar12 = this->self_kq_mask->data;
    }
    if (pgVar9 == (ggml_tensor *)0x0) {
      pvVar13 = (void *)0x0;
    }
    else {
      cVar5 = ggml_backend_buffer_is_host(pgVar9->buffer);
      if (cVar5 == '\0') {
        pcVar10 = "ggml_backend_buffer_is_host(self_kq_mask_swa->buffer)";
        uVar16 = 0x1b3;
LAB_001eb7f8:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,uVar16,"GGML_ASSERT(%s) failed",pcVar10);
      }
      pvVar13 = this->self_kq_mask_swa->data;
    }
    local_68 = (long)(int)uVar2;
    local_60 = uVar15 * uVar11 * 4;
    lVar1 = uVar11 * 4;
    local_88 = pvVar12;
    local_80 = pvVar13;
    local_50 = ubatch;
    for (local_40 = 0; local_40 != local_58; local_40 = local_40 + 1) {
      local_8c = *ubatch->seq_id[local_40];
      local_48 = local_40 * uVar15 * 4;
      local_70 = local_80;
      local_78 = local_88;
      for (local_38 = 0; local_38 != uVar15; local_38 = local_38 + 1) {
        uVar3 = *(uint *)((long)ubatch->pos + local_38 * 4 + local_48);
        lVar14 = 0;
        for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
          bVar6 = llama_kv_cell::has_seq_id
                            ((llama_kv_cell *)
                             ((long)&((this->kv_self->cells).
                                      super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pos + lVar14),
                             &local_8c);
          fVar18 = -INFINITY;
          if ((bVar6) &&
             (((this->cparams->causal_attn != true ||
               (fVar18 = -INFINITY,
               *(int *)((long)&((this->kv_self->cells).
                                super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                                _M_impl.super__Vector_impl_data._M_start)->pos + lVar14) <=
               (int)uVar3)) && (fVar18 = 0.0, this->hparams->use_alibi == true)))) {
            iVar7 = *(int *)((long)&((this->kv_self->cells).
                                     super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->pos + lVar14) -
                    uVar3;
            iVar8 = -iVar7;
            if (iVar7 < 1) {
              iVar8 = iVar7;
            }
            fVar18 = (float)iVar8;
          }
          if (pvVar12 != (void *)0x0) {
            *(float *)((long)local_78 + uVar17 * 4) = fVar18;
          }
          if (pvVar13 != (void *)0x0) {
            uVar4 = this->hparams->n_attn_chunk;
            if (uVar4 == 0) {
              if ((int)this->hparams->n_swa <=
                  (int)(uVar3 - *(int *)((long)&((this->kv_self->cells).
                                                 super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->pos +
                                        lVar14))) {
                fVar18 = -INFINITY;
              }
            }
            else {
              iVar8 = uVar3 - uVar3 % uVar4;
              fVar19 = -INFINITY;
              if (iVar8 <= *(int *)((long)&((this->kv_self->cells).
                                            super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->pos + lVar14
                                   )) {
                fVar19 = fVar18;
              }
              fVar18 = -INFINITY;
              if (iVar8 <= (int)uVar3) {
                fVar18 = fVar19;
              }
            }
            *(float *)((long)local_70 + uVar17 * 4) = fVar18;
          }
          lVar14 = lVar14 + 0x40;
        }
        local_78 = (void *)((long)local_78 + lVar1);
        local_70 = (void *)((long)local_70 + lVar1);
        ubatch = local_50;
      }
      local_88 = (void *)((long)local_88 + local_60);
      local_80 = (void *)((long)local_80 + local_60);
    }
    if (pvVar12 != (void *)0x0) {
      pvVar12 = (void *)((long)pvVar12 + local_68 * uVar11 * 4);
      for (; local_68 < (long)((ulong)uVar2 + 0x3f & 0x1ffffffc0); local_68 = local_68 + 1) {
        for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined4 *)((long)pvVar12 + uVar15 * 4) = 0xff800000;
        }
        pvVar12 = (void *)((long)pvVar12 + lVar1);
      }
    }
    if (pvVar13 != (void *)0x0) {
      lVar14 = (long)(int)uVar2;
      pvVar13 = (void *)((long)pvVar13 + lVar14 * uVar11 * 4);
      for (; lVar14 < (long)((ulong)uVar2 + 0x3f & 0x1ffffffc0); lVar14 = lVar14 + 1) {
        for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined4 *)((long)pvVar13 + uVar15 * 4) = 0xff800000;
        }
        pvVar13 = (void *)((long)pvVar13 + lVar1);
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_kv_unified::set_input(const llama_ubatch * ubatch) {
    if (self_kq_mask || self_kq_mask_swa) {
        const int64_t n_kv         = kv_self->n;
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        float * data     = nullptr;
        float * data_swa = nullptr;

        if (self_kq_mask) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask->buffer));
            data = (float *) self_kq_mask->data;
        }

        if (self_kq_mask_swa) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask_swa->buffer));
            data_swa = (float *) self_kq_mask_swa->data;
        }

        // Use only the previous KV cells of the correct sequence for each token of the ubatch.
        // It's assumed that if a token in the batch has multiple sequences, they are equivalent.
        // Example with a cache of 10 tokens, 2 tokens populated in cache and 3 tokens in batch:
        //   Causal mask:
        //      xxx-------
        //      xxxx------
        //      xxxxx-----
        //   Non-causal mask:
        //      xxxxx-----
        //      xxxxx-----
        //      xxxxx-----
        // To visualize the mask, see https://github.com/ggml-org/llama.cpp/pull/12615
        for (int h = 0; h < 1; ++h) {
            for (int s = 0; s < n_seqs; ++s) {
                const llama_seq_id seq_id = ubatch->seq_id[s][0];

                for (int j = 0; j < n_seq_tokens; ++j) {
                    const llama_pos pos = ubatch->pos[s*n_seq_tokens + j];
                    for (int i = 0; i < n_kv; ++i) {
                        float f;
                        // mask the token if:
                        if (!kv_self->cells[i].has_seq_id(seq_id) // not the correct sequence
                            || (cparams.causal_attn && kv_self->cells[i].pos > pos) // for causal, mask future tokens
                        ) {
                            f = -INFINITY;
                        } else {
                            if (hparams.use_alibi) {
                                f = -std::abs(kv_self->cells[i].pos - pos);
                            } else {
                                f = 0.0f;
                            }
                        }

                        if (data) {
                            data[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }

                        // may need to cut off old tokens for sliding window
                        // TODO @ngxson : we are currently re-using the swa logic to store the chunked mask, we should rename SWA to something more generic like "aux mask"
                        if (data_swa) {
                            if (hparams.n_attn_chunk) {
                                llama_pos pos_chunk_start = (pos / hparams.n_attn_chunk) * hparams.n_attn_chunk;
                                if (kv_self->cells[i].pos < pos_chunk_start || pos < pos_chunk_start) {
                                    f = -INFINITY;
                                }
                            } else {
                                if (pos - kv_self->cells[i].pos >= (int32_t)hparams.n_swa) {
                                    f = -INFINITY;
                                }
                            }
                            data_swa[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }
                    }
                }
            }

            // mask padded tokens
            if (data) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }

            // mask padded tokens
            if (data_swa) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data_swa[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }
        }
    }
}